

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMulti.c
# Opt level: O0

DdNode * Abc_NtkMultiDeriveBdd(DdManager *dd,Abc_Obj_t *pNodeOld,Vec_Ptr_t *vFaninsOld)

{
  void *pvVar1;
  int iVar2;
  DdNode *pDVar3;
  int local_34;
  int i;
  DdNode *bFunc;
  Abc_Obj_t *pFaninOld;
  Vec_Ptr_t *vFaninsOld_local;
  Abc_Obj_t *pNodeOld_local;
  DdManager *dd_local;
  
  iVar2 = Abc_AigNodeIsConst(pNodeOld);
  if (iVar2 != 0) {
    __assert_fail("!Abc_AigNodeIsConst(pNodeOld)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMulti.c"
                  ,0xe3,"DdNode *Abc_NtkMultiDeriveBdd(DdManager *, Abc_Obj_t *, Vec_Ptr_t *)");
  }
  iVar2 = Abc_ObjIsNode(pNodeOld);
  if (iVar2 != 0) {
    for (local_34 = 0; local_34 < vFaninsOld->nSize; local_34 = local_34 + 1) {
      pvVar1 = vFaninsOld->pArray[local_34];
      pDVar3 = Cudd_bddIthVar(dd,local_34);
      *(DdNode **)((long)pvVar1 + 0x38) = pDVar3;
      Cudd_Ref(*(DdNode **)((long)pvVar1 + 0x38));
      *(uint *)((long)pvVar1 + 0x14) = *(uint *)((long)pvVar1 + 0x14) & 0xffffffbf | 0x40;
    }
    pDVar3 = Abc_NtkMultiDeriveBdd_rec(dd,pNodeOld,vFaninsOld);
    Cudd_Ref(pDVar3);
    for (local_34 = 0; local_34 < vFaninsOld->nSize; local_34 = local_34 + 1) {
      pvVar1 = vFaninsOld->pArray[local_34];
      Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar1 + 0x38));
      *(uint *)((long)pvVar1 + 0x14) = *(uint *)((long)pvVar1 + 0x14) & 0xffffffbf;
    }
    Cudd_Deref(pDVar3);
    return pDVar3;
  }
  __assert_fail("Abc_ObjIsNode(pNodeOld)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMulti.c"
                ,0xe4,"DdNode *Abc_NtkMultiDeriveBdd(DdManager *, Abc_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

DdNode * Abc_NtkMultiDeriveBdd( DdManager * dd, Abc_Obj_t * pNodeOld, Vec_Ptr_t * vFaninsOld )
{
    Abc_Obj_t * pFaninOld;
    DdNode * bFunc;
    int i;
    assert( !Abc_AigNodeIsConst(pNodeOld) );
    assert( Abc_ObjIsNode(pNodeOld) );
    // set the elementary BDD variables for the input nodes
    for ( i = 0; i < vFaninsOld->nSize; i++ )
    {
        pFaninOld = (Abc_Obj_t *)vFaninsOld->pArray[i];
        pFaninOld->pData = Cudd_bddIthVar( dd, i );    Cudd_Ref( (DdNode *)pFaninOld->pData );
        pFaninOld->fMarkC = 1;
    }
    // call the recursive BDD computation
    bFunc = Abc_NtkMultiDeriveBdd_rec( dd, pNodeOld, vFaninsOld );  Cudd_Ref( bFunc );
    // dereference the intermediate nodes
    for ( i = 0; i < vFaninsOld->nSize; i++ )
    {
        pFaninOld = (Abc_Obj_t *)vFaninsOld->pArray[i];
        Cudd_RecursiveDeref( dd, (DdNode *)pFaninOld->pData );
        pFaninOld->fMarkC = 0;
    }
    Cudd_Deref( bFunc );
    return bFunc;
}